

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

sat_solver * Sbm_AddCardinSolver(int LogN,Vec_Int_t **pvVars)

{
  int n;
  byte bVar1;
  int iVar2;
  Vec_Int_t *vVars;
  ulong uVar3;
  sat_solver *s;
  int K;
  uint nCap;
  ulong uVar4;
  
  bVar1 = (byte)LogN & 0x1f;
  nCap = 1 << bVar1;
  vVars = Vec_IntAlloc(nCap);
  vVars->nSize = nCap;
  uVar3 = 0;
  uVar4 = (ulong)nCap;
  if (1 << bVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    vVars->pArray[uVar3] = (int)uVar3;
  }
  n = nCap * 3 + -2 + (((LogN + -1) * (LogN << ((byte)LogN & 0x1f))) / 4) * 2;
  s = sat_solver_new();
  sat_solver_setnvars(s,n);
  iVar2 = Sbm_AddCardinConstrPairWise(s,vVars,K);
  if (iVar2 == n) {
    *pvVars = vVars;
    return s;
  }
  __assert_fail("nVarsReal == nVarsAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatMap.c"
                ,0x160,"sat_solver *Sbm_AddCardinSolver(int, Vec_Int_t **)");
}

Assistant:

sat_solver * Sbm_AddCardinSolver( int LogN, Vec_Int_t ** pvVars )
{
    int nVars = 1 << LogN;
    int nVarsAlloc = nVars + 2 * (nVars * LogN * (LogN-1) / 4 + nVars - 1), nVarsReal;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVarsAlloc );
    nVarsReal = Sbm_AddCardinConstrPairWise( pSat, vVars, 2 );
    assert( nVarsReal == nVarsAlloc );
    *pvVars = vVars;
    return pSat;
}